

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

double units::read1To10(string *str,size_t *index)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = 0x10;
  do {
    iVar1 = *(int *)(&UNK_00587508 + lVar3);
    iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)str,*index,
                    (long)iVar1,*(char **)((long)&lt10 + lVar3));
    if (iVar2 == 0) {
      *index = *index + (long)iVar1;
      return *(double *)(&UNK_00587510 + lVar3);
    }
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0xe8);
  return NAN;
}

Assistant:

static double read1To10(const std::string& str, size_t& index)
{
    for (const auto& num : lt10) {
        if (str.compare(index, std::get<2>(num), std::get<0>(num)) == 0) {
            index += std::get<2>(num);
            return std::get<1>(num);
        }
    }
    return constants::invalid_conversion;
}